

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O3

void Aig_ManPackPrintCare(Aig_ManPack_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  iVar1 = p->pAig->vCis->nSize;
  if (0 < iVar1) {
    uVar2 = p->vPiCare->nSize;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    if (uVar3 <= iVar1 - 1U) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                    ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
    }
  }
  return;
}

Assistant:

void Aig_ManPackPrintCare( Aig_ManPack_t * p )
{
    Aig_Obj_t * pObj;
    word Sign;
    int i;
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        Sign = Vec_WrdEntry( p->vPiCare, i );
//        Extra_PrintBinary( stdout, (unsigned *)&Sign, 64 );
//        printf( "\n" );
    }
//    printf( "\n" );
}